

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdUpdateTxOutAmount
              (void *handle,int net_type,char *tx_hex_string,uint32_t index,int64_t amount,
              char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_10a;
  bool is_bitcoin;
  string local_108;
  TransactionContext tx;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x5e4;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7cf8;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_108);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string != (char **)0x0) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_10a);
      cfd::TransactionContext::TransactionContext(&tx,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      cfd::core::Amount::Amount((Amount *)&local_108,amount);
      cfd::core::Transaction::SetTxOutValue(&tx.super_Transaction,index,(Amount *)&local_108);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_108,(AbstractTransaction *)&tx);
      pcVar2 = cfd::capi::CreateString(&local_108);
      *tx_string = pcVar2;
      std::__cxx11::string::~string((string *)&local_108);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_10a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      cfd::core::Amount::Amount((Amount *)&local_108,amount);
      cfd::core::ConfidentialTransaction::SetTxOutValue
                ((ConfidentialTransaction *)&tx,index,(Amount *)&local_108);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_108,(AbstractTransaction *)&tx);
      pcVar2 = cfd::capi::CreateString(&local_108);
      *tx_string = pcVar2;
      std::__cxx11::string::~string((string *)&local_108);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
    }
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4fe2f6;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x5ea;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7cf8;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx output is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx output is null.",(allocator *)&local_108);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUpdateTxOutAmount(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    int64_t amount, char** tx_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.SetTxOutValue(index, Amount(amount));
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.SetTxOutValue(index, Amount(amount));
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}